

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void __thiscall
GEO::PeriodicDelaunay3d::get_incident_tets(PeriodicDelaunay3d *this,index_t v,IncidentTetrahedra *W)

{
  uint uVar1;
  bool bVar2;
  index_t in_EAX;
  index_t iVar3;
  vector<int> *pvVar4;
  _Elt_pointer puVar5;
  uint uVar6;
  index_t neigh;
  index_t local_34;
  
  neigh = in_EAX;
  IncidentTetrahedra::clear_incident_tets(W);
  uVar1 = *(uint *)&(this->super_Delaunay).field_0xf4;
  if (v < uVar1) {
    pvVar4 = &(this->super_Delaunay).v_to_cell_;
    iVar3 = v;
  }
  else {
    uVar6 = ~(-1 << ((byte)(v / uVar1) & 0x1f)) &
            (this->vertex_instances_).
            super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
            super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
            _M_impl.super__Vector_impl_data._M_start[(ulong)v % (ulong)uVar1];
    uVar6 = uVar6 - (uVar6 >> 1 & 0x15555555);
    uVar6 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333);
    pvVar4 = (vector<int> *)&this->periodic_v_to_cell_data_;
    iVar3 = ((this->periodic_v_to_cell_rowptr_).
             super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
             super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
             _M_impl.super__Vector_impl_data._M_start[(ulong)v % (ulong)uVar1] +
            (((uVar6 >> 4) + uVar6 & 0xf0f0f0f) * 0x1010101 >> 0x18)) - 1;
  }
  iVar3 = (pvVar4->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
          super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
          super__Vector_impl_data._M_start[iVar3];
  _neigh = CONCAT44(iVar3,neigh);
  if (iVar3 != 0xffffffff) {
    IncidentTetrahedra::add_incident_tet(W,iVar3);
    std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)W,&local_34);
    while (puVar5 = (W->S).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur,
          puVar5 != (W->S).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur) {
      if (puVar5 == (W->S).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
        puVar5 = (W->S).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
      }
      local_34 = puVar5[-1];
      std::deque<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)W);
      iVar3 = PeriodicDelaunay3dThread::find_4
                        ((this->cell_to_v_store_).
                         super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                         super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                         super__Vector_impl_data._M_start + (local_34 << 2),v);
      neigh = (this->cell_to_cell_store_).
              super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
              super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
              super__Vector_impl_data._M_start[(iVar3 + 1 & 3) + local_34 * 4];
      if (neigh != 0xffffffff) {
        bVar2 = IncidentTetrahedra::has_incident_tet(W,neigh);
        if (!bVar2) {
          IncidentTetrahedra::add_incident_tet(W,neigh);
          std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)W,&neigh);
        }
      }
      neigh = (this->cell_to_cell_store_).
              super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
              super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
              super__Vector_impl_data._M_start[(iVar3 & 3) + local_34 * 4 ^ 2];
      if (neigh != 0xffffffff) {
        bVar2 = IncidentTetrahedra::has_incident_tet(W,neigh);
        if (!bVar2) {
          IncidentTetrahedra::add_incident_tet(W,neigh);
          std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)W,&neigh);
        }
      }
      iVar3 = (this->cell_to_cell_store_).
              super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
              super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
              super__Vector_impl_data._M_start[(iVar3 - 1 & 3) + local_34 * 4];
      _neigh = CONCAT44(local_34,iVar3);
      if (iVar3 != 0xffffffff) {
        bVar2 = IncidentTetrahedra::has_incident_tet(W,iVar3);
        if (!bVar2) {
          IncidentTetrahedra::add_incident_tet(W,neigh);
          std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)W,&neigh);
        }
      }
    }
  }
  return;
}

Assistant:

void PeriodicDelaunay3d::get_incident_tets(
	index_t v, IncidentTetrahedra& W
    ) const {

	geo_debug_assert(
	    periodic_ || v < nb_vertices_non_periodic_
	);

	W.clear_incident_tets();

	index_t t = index_t(-1);
	if(v < nb_vertices_non_periodic_) {
	    t = index_t(v_to_cell_[v]);
	} else {
	    index_t v_real = periodic_vertex_real(v);
	    index_t v_instance = periodic_vertex_instance(v);
	    
	    geo_debug_assert(
		(vertex_instances_[v_real] & (1u << v_instance))!=0
	    );

	    index_t slot = pop_count(
		vertex_instances_[v_real] & ((1u << v_instance)-1)
	    ) - 1;

	    t = periodic_v_to_cell_data_[
		periodic_v_to_cell_rowptr_[v_real] + slot
	    ];
	}
	
	// Can happen: empty power cell.
	if(t == index_t(-1)) {
	    return;
	}

	// TODO: different version if CICL is stored ?
	{
	    W.add_incident_tet(t);
	    W.S.push(t);
	    while(!W.S.empty()) {
		t = W.S.top();
		W.S.pop();
		const signed_index_t* T = &(cell_to_v_store_[4 * t]);
		index_t lv = PeriodicDelaunay3dThread::find_4(
		    T,signed_index_t(v)
		);
		index_t neigh = index_t(cell_to_cell_store_[4*t + (lv + 1)%4]);
		if(neigh != index_t(-1) && !W.has_incident_tet(neigh)) {
		    W.add_incident_tet(neigh);
		    W.S.push(neigh);
		}
		neigh = index_t(cell_to_cell_store_[4*t + (lv + 2)%4]);
		if(neigh != index_t(-1) && !W.has_incident_tet(neigh)) {
		    W.add_incident_tet(neigh);
		    W.S.push(neigh);
		}
		neigh = index_t(cell_to_cell_store_[4*t + (lv + 3)%4]);
		if(neigh != index_t(-1) && !W.has_incident_tet(neigh)) {
		    W.add_incident_tet(neigh);
		    W.S.push(neigh);
		}
	    }
	}
    }